

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O0

void Abc_ObjDeleteFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  int iVar1;
  Abc_Obj_t *pFanin_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x71,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsComplement(pFanin);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x72,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pObj->pNtk != pFanin->pNtk) {
    __assert_fail("pObj->pNtk == pFanin->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x73,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if ((-1 < pObj->Id) && (-1 < pFanin->Id)) {
    iVar1 = Vec_IntRemove(&pObj->vFanins,pFanin->Id);
    if (iVar1 == 0) {
      printf("The obj %d is not found among the fanins of obj %d ...\n",(ulong)(uint)pFanin->Id,
             (ulong)(uint)pObj->Id);
    }
    else {
      iVar1 = Vec_IntRemove(&pFanin->vFanouts,pObj->Id);
      if (iVar1 == 0) {
        printf("The obj %d is not found among the fanouts of obj %d ...\n",(ulong)(uint)pObj->Id,
               (ulong)(uint)pFanin->Id);
      }
    }
    return;
  }
  __assert_fail("pObj->Id >= 0 && pFanin->Id >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                ,0x74,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_ObjDeleteFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    assert( !Abc_ObjIsComplement(pObj) );
    assert( !Abc_ObjIsComplement(pFanin) );
    assert( pObj->pNtk == pFanin->pNtk );
    assert( pObj->Id >= 0 && pFanin->Id >= 0 );
    if ( !Vec_IntRemove( &pObj->vFanins, pFanin->Id ) )
    {
        printf( "The obj %d is not found among the fanins of obj %d ...\n", pFanin->Id, pObj->Id );
        return;
    }
    if ( !Vec_IntRemove( &pFanin->vFanouts, pObj->Id ) )
    {
        printf( "The obj %d is not found among the fanouts of obj %d ...\n", pObj->Id, pFanin->Id );
        return;
    }
}